

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
::transfer_n(btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
             *this,size_type n,size_type dest_i,size_type src_i,
            btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
            *src_node,allocator_type *alloc)

{
  slot_type *psVar1;
  slot_type *local_50;
  slot_type *dest;
  slot_type *end;
  slot_type *src;
  allocator_type *alloc_local;
  btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
  *src_node_local;
  size_type src_i_local;
  size_type dest_i_local;
  size_type n_local;
  btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
  *this_local;
  
  next_generation(this);
  end = slot(src_node,src_i);
  psVar1 = end + n;
  local_50 = slot(this,dest_i);
  for (; end != psVar1; end = end + 1) {
    transfer(local_50,end,alloc);
    local_50 = local_50 + 1;
  }
  return;
}

Assistant:

void transfer_n(const size_type n, const size_type dest_i,
                  const size_type src_i, btree_node *src_node,
                  allocator_type *alloc) {
    next_generation();
    for (slot_type *src = src_node->slot(src_i), *end = src + n,
                   *dest = slot(dest_i);
         src != end; ++src, ++dest) {
      transfer(dest, src, alloc);
    }
  }